

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_set_read_type(coda_type *type,coda_native_type read_type)

{
  char *pcVar1;
  char *pcVar2;
  coda_native_type read_type_local;
  coda_type *type_local;
  
  if (type == (coda_type *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x2b7);
  }
  else {
    switch(type->type_class) {
    case coda_record_class:
    case coda_array_class:
    case coda_raw_class:
    case coda_special_class:
      pcVar1 = coda_type_get_class_name(type->type_class);
      coda_set_error(-400,"read type cannot be set explicitly for %s type",pcVar1);
      return -1;
    case coda_integer_class:
      if (((((read_type == coda_native_type_int8) || (read_type == coda_native_type_uint8)) ||
           (read_type == coda_native_type_int16)) ||
          ((read_type == coda_native_type_uint16 || (read_type == coda_native_type_int32)))) ||
         ((read_type == coda_native_type_uint32 ||
          ((read_type == coda_native_type_int64 || (read_type == coda_native_type_uint64)))))) {
        type->read_type = read_type;
        return 0;
      }
      break;
    case coda_real_class:
      if ((read_type == coda_native_type_float) || (read_type == coda_native_type_double)) {
        type->read_type = read_type;
        return 0;
      }
      break;
    case coda_text_class:
      if ((read_type == coda_native_type_char) || (read_type == coda_native_type_string)) {
        type->read_type = read_type;
        return 0;
      }
    }
    pcVar1 = coda_type_get_native_type_name(read_type);
    pcVar2 = coda_type_get_class_name(type->type_class);
    coda_set_error(-400,"invalid read type (%s) for %s type",pcVar1,pcVar2);
  }
  return -1;
}

Assistant:

int coda_type_set_read_type(coda_type *type, coda_native_type read_type)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    switch (type->type_class)
    {
        case coda_record_class:
        case coda_array_class:
        case coda_raw_class:
        case coda_special_class:
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "read type cannot be set explicitly for %s type",
                           coda_type_get_class_name(type->type_class));
            return -1;
        case coda_integer_class:
            if (read_type == coda_native_type_int8 || read_type == coda_native_type_uint8 ||
                read_type == coda_native_type_int16 || read_type == coda_native_type_uint16 ||
                read_type == coda_native_type_int32 || read_type == coda_native_type_uint32 ||
                read_type == coda_native_type_int64 || read_type == coda_native_type_uint64)
            {
                type->read_type = read_type;
                return 0;
            }
            break;
        case coda_real_class:
            if (read_type == coda_native_type_float || read_type == coda_native_type_double)
            {
                type->read_type = read_type;
                return 0;
            }
            break;
        case coda_text_class:
            if (read_type == coda_native_type_char || read_type == coda_native_type_string)
            {
                type->read_type = read_type;
                return 0;
            }
            break;
    }

    coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid read type (%s) for %s type",
                   coda_type_get_native_type_name(read_type), coda_type_get_class_name(type->type_class));
    return -1;
}